

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  size_t sVar1;
  StorageClass SVar2;
  StorageClass SVar3;
  SPIRType *pSVar4;
  SPIRVariable *pSVar5;
  SPIRConstant *c;
  string sStack_68;
  string local_48;
  
  pSVar4 = Compiler::expression_type((Compiler *)this,id_rhs);
  sVar1 = (pSVar4->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    pSVar5 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id_lhs);
    if (((pSVar5 == (SPIRVariable *)0x0) || (pSVar5->remapped_variable != true)) ||
       (pSVar5->statically_assigned == false)) {
      if (((pSVar5 == (SPIRVariable *)0x0) ||
          ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr[id_rhs].type != TypeConstant)) || (pSVar5->deferred_declaration != true)) {
        pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,id_lhs);
        if (pSVar5 != (SPIRVariable *)0x0) {
          CompilerGLSL::flush_variable_declaration
                    (&this->super_CompilerGLSL,(pSVar5->super_IVariant).self.id);
        }
        CompilerGLSL::to_expression_abi_cxx11_(&sStack_68,&this->super_CompilerGLSL,id_lhs,true);
        SVar2 = Compiler::get_expression_effective_storage_class((Compiler *)this,id_lhs);
        SVar3 = Compiler::get_expression_effective_storage_class((Compiler *)this,id_rhs);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x30])
                  (this,&sStack_68,(ulong)id_rhs,(ulong)SVar2,(ulong)SVar3);
        ::std::__cxx11::string::~string((string *)&sStack_68);
        Compiler::register_write((Compiler *)this,id_lhs);
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&sStack_68,&this->super_CompilerGLSL,id_lhs,true);
        c = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,id_rhs);
        CompilerGLSL::constant_expression_abi_cxx11_(&local_48,&this->super_CompilerGLSL,c);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&sStack_68,(char (*) [4])0x31e8c7,&local_48,
                   (char (*) [2])0x304bae);
        ::std::__cxx11::string::~string((string *)&local_48);
        ::std::__cxx11::string::~string((string *)&sStack_68);
      }
    }
  }
  return sVar1 != 0;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_rhs);
	if (type.array.size() == 0)
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	// Ensure the LHS variable has been declared
	auto *p_v_lhs = maybe_get_backing_variable(id_lhs);
	if (p_v_lhs)
		flush_variable_declaration(p_v_lhs->self);

	emit_array_copy(to_expression(id_lhs), id_rhs, get_expression_effective_storage_class(id_lhs),
	                get_expression_effective_storage_class(id_rhs));
	register_write(id_lhs);

	return true;
}